

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.cpp
# Opt level: O0

ggml_status ggml_backend_cpu_graph_compute(ggml_backend_t backend,ggml_cgraph *cgraph)

{
  long lVar1;
  ggml_status gVar2;
  void *pvVar3;
  long in_RDI;
  ggml_cplan cplan;
  ggml_backend_cpu_context *cpu_ctx;
  ggml_threadpool *in_stack_000000c0;
  int in_stack_000000cc;
  ggml_cgraph *in_stack_000000d0;
  ggml_cplan *in_stack_000001c8;
  ggml_cgraph *in_stack_000001d0;
  ulong local_50;
  
  lVar1 = *(long *)(in_RDI + 0x78);
  ggml_graph_plan(in_stack_000000d0,in_stack_000000cc,in_stack_000000c0);
  if (*(ulong *)(lVar1 + 0x18) < local_50) {
    if (*(void **)(lVar1 + 0x10) != (void *)0x0) {
      operator_delete__(*(void **)(lVar1 + 0x10));
    }
    pvVar3 = operator_new__(local_50);
    *(void **)(lVar1 + 0x10) = pvVar3;
    if (*(long *)(lVar1 + 0x10) == 0) {
      *(undefined8 *)(lVar1 + 0x18) = 0;
      return GGML_STATUS_ALLOC_FAILED;
    }
    *(ulong *)(lVar1 + 0x18) = local_50;
  }
  gVar2 = ggml_graph_compute(in_stack_000001d0,in_stack_000001c8);
  return gVar2;
}

Assistant:

static enum ggml_status ggml_backend_cpu_graph_compute(ggml_backend_t backend, struct ggml_cgraph * cgraph) {
    struct ggml_backend_cpu_context * cpu_ctx = (struct ggml_backend_cpu_context *)backend->context;

    struct ggml_cplan cplan = ggml_graph_plan(cgraph, cpu_ctx->n_threads, cpu_ctx->threadpool);

    if (cpu_ctx->work_size < cplan.work_size) {
        delete[] cpu_ctx->work_data;
        cpu_ctx->work_data = new uint8_t[cplan.work_size];
        if (cpu_ctx->work_data == NULL) {
            cpu_ctx->work_size = 0;
            return GGML_STATUS_ALLOC_FAILED;
        }
        cpu_ctx->work_size = cplan.work_size;
    }
    cplan.work_data = (uint8_t *)cpu_ctx->work_data;

    cplan.abort_callback      = cpu_ctx->abort_callback;
    cplan.abort_callback_data = cpu_ctx->abort_callback_data;

    return ggml_graph_compute(cgraph, &cplan);
}